

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O2

bool __thiscall
glcts::GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::checkResult
          (GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest *this,
          CapturedVaryings *captured_data,uint index,uint texture_size)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TestLog *pTVar7;
  ulong uVar8;
  ulong uVar9;
  TestError *this_00;
  size_t __n;
  pointer __n_00;
  long lVar10;
  void *__buf;
  void *__buf_00;
  int iVar11;
  int iVar12;
  allocator<char> local_21a;
  allocator<char> local_219;
  TestLog *local_218;
  int local_20c;
  string local_208;
  string local_1e8;
  GLint expected_values [4];
  undefined1 local_1b0 [384];
  
  __n_00 = (this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).m_offsets_buffer_data.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar2 = __n_00[index * 2];
  iVar3 = __n_00[(ulong)(index * 2) + 1];
  lVar10 = 0;
  while( true ) {
    if (lVar10 == 0x10) {
      local_218 = ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                   super_GPUShader5TextureGatherOffsetDepthTestBase.
                   super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"Unexpected sampling results",&local_219);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,fixed_sample_locations_values + 1,&local_21a);
      tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1e8,&local_208);
      tcu::LogSection::write((LogSection *)local_1b0,(int)local_218,__buf_00,(size_t)__n_00);
      tcu::LogSection::~LogSection((LogSection *)local_1b0);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      GPUShader5TextureGatherOffsetTestBase::logCoordinates
                ((GPUShader5TextureGatherOffsetTestBase *)this,index);
      local_1b0._0_8_ =
           ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
            super_GPUShader5TextureGatherOffsetDepthTestBase.
            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Texture size: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b0._0_8_ =
           ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
            super_GPUShader5TextureGatherOffsetDepthTestBase.
            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Offsets: ");
      std::ostream::operator<<(poVar1,iVar2);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,iVar3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      GPUShader5TextureGatherOffsetDepthTestBase::logVaryings
                ((GPUShader5TextureGatherOffsetDepthTestBase *)this,captured_data);
      tcu::TestLog::endSection
                (((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                  super_GPUShader5TextureGatherOffsetDepthTestBase.
                  super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unexpected sampling results",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5TextureGatherOffset.cpp"
                 ,0xb6f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (*(uint *)((long)captured_data->without_offset + lVar10) != texture_size) break;
    lVar10 = lVar10 + 4;
  }
  iVar4 = captured_data->floor_tex_coord[0];
  iVar5 = *(int *)((long)captured_data->without_offset + lVar10);
  iVar6 = *(int *)((long)GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                         gather_offsets_x + lVar10);
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 4) {
    iVar12 = *(int *)((long)GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                            gather_offsets_x + lVar10) +
             ((iVar5 + iVar2) - iVar6) + iVar4 * texture_size;
    *(int *)((long)expected_values + lVar10) = iVar12;
    if (iVar12 < 0) {
      iVar11 = 0;
LAB_00caada0:
      *(int *)((long)expected_values + lVar10) = iVar11;
    }
    else {
      iVar11 = texture_size - 1;
      if ((int)(texture_size - 1) < iVar12) goto LAB_00caada0;
    }
  }
  uVar8 = 0;
  do {
    uVar9 = uVar8;
    if (uVar9 == 4) goto LAB_00caaf28;
    __n = (size_t)(uint)captured_data->with_offset[uVar9];
    uVar8 = uVar9 + 1;
  } while (captured_data->with_offset[uVar9] == expected_values[uVar9]);
  local_218 = (TestLog *)CONCAT44(local_218._4_4_,iVar3);
  pTVar7 = ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
            super_GPUShader5TextureGatherOffsetDepthTestBase.
            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_20c = iVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"Invalid result",&local_219);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,fixed_sample_locations_values + 1,&local_21a);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1e8,&local_208);
  tcu::LogSection::write((LogSection *)local_1b0,(int)pTVar7,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)local_1b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  GPUShader5TextureGatherOffsetTestBase::logCoordinates
            ((GPUShader5TextureGatherOffsetTestBase *)this,index);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
        super_GPUShader5TextureGatherOffsetDepthTestBase.super_GPUShader5TextureGatherOffsetTestBase
        .super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Texture size: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
        super_GPUShader5TextureGatherOffsetDepthTestBase.super_GPUShader5TextureGatherOffsetTestBase
        .super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Offsets: ");
  iVar2 = (int)local_218;
  std::ostream::operator<<(poVar1,local_20c);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,iVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  GPUShader5TextureGatherOffsetDepthTestBase::logVaryings
            ((GPUShader5TextureGatherOffsetDepthTestBase *)this,captured_data);
  tcu::TestLog::endSection
            (((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
              super_GPUShader5TextureGatherOffsetDepthTestBase.
              super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
LAB_00caaf28:
  return 3 < uVar9;
}

Assistant:

bool GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::checkResult(const CapturedVaryings& captured_data,
																		  unsigned int index, unsigned int texture_size)
{
	/* Get offsets for vertex */
	glw::GLint x_offset;
	glw::GLint y_offset;

	getOffsets(x_offset, y_offset, index);

	/* Storage for expected values of with_offset varyings */
	glw::GLint expected_values[m_n_components_per_varying];

	/* Index of first not clamped texel in without_offset set*/
	int not_clamped_texel_index = -1;

	/* X offsets of texels in 2x2 set */
	static const glw::GLint gather_offsets_x[] = { 0, 1, 1, 0 };

	/* Find first not clamped texel in without_offset set */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if ((int)texture_size != captured_data.without_offset[i])
		{
			not_clamped_texel_index = i;
			break;
		}
	}

	if (-1 == not_clamped_texel_index)
	{
		/* Log problem with sampler */
		m_testCtx.getLog() << tcu::TestLog::Section("Unexpected sampling results", "");

		logCoordinates(index);

		m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: " << x_offset << ", " << y_offset
						   << tcu::TestLog::EndMessage;

		logVaryings(captured_data);

		m_testCtx.getLog() << tcu::TestLog::EndSection;

		TCU_FAIL("Unexpected sampling results");
	}

	/* Fraction part of position for lower left texel without_offset set */
	const glw::GLint fract_position_x =
		captured_data.without_offset[not_clamped_texel_index] - gather_offsets_x[not_clamped_texel_index];

	/* Absolute position of lower left corner in without_offset set */
	const glw::GLint absolute_position_x = fract_position_x + captured_data.floor_tex_coord[0] * (int)texture_size;

	/* Calculate expected values of with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		expected_values[i] = absolute_position_x + gather_offsets_x[i];
		expected_values[i] += x_offset;

		/* Clamp when point is outside of texture */
		clamp(expected_values[i], 0, ((glw::GLint)texture_size) - 1);
	}

	/* Verify that expected_values match those in with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if (captured_data.with_offset[i] != expected_values[i])
		{
			/* Log invalid results */
			m_testCtx.getLog() << tcu::TestLog::Section("Invalid result", "");

			logCoordinates(index);

			m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

			m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: " << x_offset << ", " << y_offset
							   << tcu::TestLog::EndMessage;

			logVaryings(captured_data);

			m_testCtx.getLog() << tcu::TestLog::EndSection;

			/* Done */
			return false;
		}
	}

	/* Done */
	return true;
}